

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.hpp
# Opt level: O3

RETURN_TYPE __thiscall
duckdb::DBConfig::GetSetting<duckdb::EnableViewDependenciesSetting>
          (DBConfig *this,ClientContext *context)

{
  bool bVar1;
  int iVar2;
  Value VStack_58;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 == 0) {
    EnableViewDependenciesSetting::GetSetting(&VStack_58,context);
    bVar1 = Value::GetValue<bool>(&VStack_58);
    Value::~Value(&VStack_58);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return bVar1;
  }
  ::std::__throw_system_error(iVar2);
}

Assistant:

typename OP::RETURN_TYPE GetSetting(const ClientContext &context) {
		std::lock_guard<mutex> lock(config_lock);
		return OP::GetSetting(context).template GetValue<typename OP::RETURN_TYPE>();
	}